

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::get_integer_width_for_instruction
          (CompilerGLSL *this,Instruction *instr)

{
  ushort uVar1;
  uint32_t *puVar2;
  SPIRType *pSVar3;
  uint32_t uVar4;
  
  uVar4 = 0x20;
  if (2 < instr->length) {
    puVar2 = Compiler::stream(&this->super_Compiler,instr);
    uVar1 = instr->op;
    if ((uVar1 - 0xaa < 10) || (uVar1 - 0x6f < 4)) {
      pSVar3 = Compiler::expression_type(&this->super_Compiler,puVar2[2]);
    }
    else if (uVar1 - 0x97 < 2) {
      pSVar3 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,*puVar2);
      pSVar3 = Compiler::get<diligent_spirv_cross::SPIRType>
                         (&this->super_Compiler,
                          ((pSVar3->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          .ptr)->id);
    }
    else {
      pSVar3 = Compiler::maybe_get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,*puVar2);
      if (pSVar3 == (SPIRType *)0x0) {
        return 0x20;
      }
      if (7 < pSVar3->basetype - SByte) {
        return 0x20;
      }
    }
    uVar4 = pSVar3->width;
  }
  return uVar4;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	case OpSMulExtended:
	case OpUMulExtended:
		return get<SPIRType>(get<SPIRType>(ops[0]).member_types[0]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}